

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mustache.hpp
# Opt level: O0

walk_control __thiscall
kainjow::mustache::
basic_mustache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
render_component(basic_mustache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *this,render_handler *handler,
                context_internal<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *ctx,component<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *comp)

{
  bool bVar1;
  int iVar2;
  mstch_tag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pmVar3;
  undefined4 extraout_var;
  basic_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pbVar4;
  element_type *text;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  basic_partial<std::__cxx11::basic_string<char>_> *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  string_type *psVar6;
  element_type *peVar7;
  undefined1 local_130 [8];
  basic_mustache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  tmpl;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *partial_result;
  basic_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *var;
  mstch_tag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *tag;
  component<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *comp_local;
  context_internal<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *ctx_local;
  render_handler *handler_local;
  basic_mustache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_local;
  undefined4 extraout_var_00;
  
  bVar1 = component<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::is_text(comp);
  if (bVar1) {
    bVar1 = component<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::is_newline(comp);
    if (bVar1) {
      render_current_line(this,handler,ctx,comp);
    }
    else {
      render_result(this,ctx,&comp->text);
    }
    return walk;
  }
  pmVar3 = &comp->tag;
  switch((comp->tag).type) {
  case variable:
  case unescaped_variable:
    iVar2 = (*ctx->ctx->_vptr_basic_context[4])(ctx->ctx,pmVar3);
    if (((basic_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)CONCAT44(extraout_var,iVar2) !=
         (basic_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)0x0) &&
       (bVar1 = render_variable(this,handler,
                                (basic_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 *)CONCAT44(extraout_var,iVar2),ctx,(comp->tag).type == variable),
       !bVar1)) {
      return stop;
    }
    break;
  case section_begin:
    iVar2 = (*ctx->ctx->_vptr_basic_context[4])(ctx->ctx,pmVar3);
    pbVar4 = (basic_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)CONCAT44(extraout_var_00,iVar2);
    if (pbVar4 != (basic_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)0x0) {
      bVar1 = basic_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::is_lambda(pbVar4);
      if ((bVar1) ||
         (bVar1 = basic_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::is_lambda2(pbVar4), bVar1)) {
        text = Catch::clara::std::
               __shared_ptr_access<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator*((__shared_ptr_access<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)&(comp->tag).section_text);
        bVar1 = render_lambda(this,handler,pbVar4,ctx,optional,text,true);
        if (!bVar1) {
          return stop;
        }
      }
      else {
        bVar1 = basic_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::is_false(pbVar4);
        if ((!bVar1) &&
           (bVar1 = basic_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::is_empty_list(pbVar4), !bVar1)) {
          render_section(this,handler,ctx,comp,pbVar4);
        }
      }
    }
    return skip;
  default:
    break;
  case section_begin_inverted:
    iVar2 = (*ctx->ctx->_vptr_basic_context[4])(ctx->ctx,pmVar3);
    pbVar4 = (basic_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)CONCAT44(extraout_var_01,iVar2);
    if (((pbVar4 == (basic_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)0x0) ||
        (bVar1 = basic_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::is_false(pbVar4), bVar1)) ||
       (bVar1 = basic_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::is_empty_list(pbVar4), bVar1)) {
      render_section(this,handler,ctx,comp,pbVar4);
    }
    return skip;
  case partial:
    iVar2 = (*ctx->ctx->_vptr_basic_context[5])(ctx->ctx,pmVar3);
    pbVar4 = (basic_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)CONCAT44(extraout_var_02,iVar2);
    if ((pbVar4 != (basic_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)0x0) &&
       ((bVar1 = basic_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::is_partial(pbVar4), bVar1 ||
        (bVar1 = basic_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::is_string(pbVar4), bVar1)))) {
      bVar1 = basic_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::is_partial(pbVar4);
      if (bVar1) {
        this_00 = basic_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::partial_value(pbVar4);
        Catch::clara::std::
        function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
        ::operator()((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &tmpl.escape_._M_invoker,this_00);
      }
      else {
        pbVar5 = basic_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::string_value(pbVar4);
        std::__cxx11::string::string((string *)&tmpl.escape_._M_invoker,(string *)pbVar5);
      }
      basic_mustache((basic_mustache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)local_130,(string_type *)&tmpl.escape_._M_invoker);
      set_custom_escape((basic_mustache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)local_130,&this->escape_);
      bVar1 = is_valid((basic_mustache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)local_130);
      if (bVar1) {
        render((basic_mustache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_130,handler,ctx,false);
        bVar1 = is_valid((basic_mustache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)local_130);
        if (!bVar1) {
          psVar6 = error_message((basic_mustache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)local_130);
          std::__cxx11::string::operator=((string *)this,(string *)psVar6);
        }
      }
      else {
        psVar6 = error_message((basic_mustache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)local_130);
        std::__cxx11::string::operator=((string *)this,(string *)psVar6);
      }
      bVar1 = is_valid((basic_mustache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)local_130);
      if (!bVar1) {
        this_local._4_4_ = stop;
      }
      ~basic_mustache((basic_mustache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)local_130);
      std::__cxx11::string::~string((string *)&tmpl.escape_._M_invoker);
      if (!bVar1) {
        return this_local._4_4_;
      }
    }
    break;
  case set_delimiter:
    peVar7 = Catch::clara::std::
             __shared_ptr_access<kainjow::mustache::delimiter_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator*((__shared_ptr_access<kainjow::mustache::delimiter_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&(comp->tag).delim_set);
    delimiter_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator=(&ctx->delim_set,peVar7);
  }
  return walk;
}

Assistant:

typename component<string_type>::walk_control render_component(const render_handler& handler, context_internal<string_type>& ctx, component<string_type>& comp) {
        if (comp.is_text()) {
            if (comp.is_newline()) {
                render_current_line(handler, ctx, &comp);
            } else {
                render_result(ctx, comp.text);
            }
            return component<string_type>::walk_control::walk;
        }

        const mstch_tag<string_type>& tag{comp.tag};
        const basic_data<string_type>* var = nullptr;
        switch (tag.type) {
            case tag_type::variable:
            case tag_type::unescaped_variable:
                if ((var = ctx.ctx.get(tag.name)) != nullptr) {
                    if (!render_variable(handler, var, ctx, tag.type == tag_type::variable)) {
                        return component<string_type>::walk_control::stop;
                    }
                }
                break;
            case tag_type::section_begin:
                if ((var = ctx.ctx.get(tag.name)) != nullptr) {
                    if (var->is_lambda() || var->is_lambda2()) {
                        if (!render_lambda(handler, var, ctx, render_lambda_escape::optional, *comp.tag.section_text, true)) {
                            return component<string_type>::walk_control::stop;
                        }
                    } else if (!var->is_false() && !var->is_empty_list()) {
                        render_section(handler, ctx, comp, var);
                    }
                }
                return component<string_type>::walk_control::skip;
            case tag_type::section_begin_inverted:
                if ((var = ctx.ctx.get(tag.name)) == nullptr || var->is_false() || var->is_empty_list()) {
                    render_section(handler, ctx, comp, var);
                }
                return component<string_type>::walk_control::skip;
            case tag_type::partial:
                if ((var = ctx.ctx.get_partial(tag.name)) != nullptr && (var->is_partial() || var->is_string())) {
                    const auto& partial_result = var->is_partial() ? var->partial_value()() : var->string_value();
                    basic_mustache tmpl{partial_result};
                    tmpl.set_custom_escape(escape_);
                    if (!tmpl.is_valid()) {
                        error_message_ = tmpl.error_message();
                    } else {
                        tmpl.render(handler, ctx, false);
                        if (!tmpl.is_valid()) {
                            error_message_ = tmpl.error_message();
                        }
                    }
                    if (!tmpl.is_valid()) {
                        return component<string_type>::walk_control::stop;
                    }
                }
                break;
            case tag_type::set_delimiter:
                ctx.delim_set = *comp.tag.delim_set;
                break;
            default:
                break;
        }

        return component<string_type>::walk_control::walk;
    }